

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeWebAssemblyObject
               (DynamicObject *webAssemblyObject,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  undefined8 in_RAX;
  DynamicObject *object;
  JavascriptFunction *ptr;
  RuntimeFunction *pRVar1;
  JavascriptString *pJVar2;
  JavascriptLibrary *this_00;
  uint uVar4;
  ulong uVar3;
  
  uVar4 = (uint)((ulong)in_RAX >> 0x20);
  this = (((webAssemblyObject->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  DeferredTypeHandlerBase::Convert(typeHandler,webAssemblyObject,mode,10,0);
  object = CreateObject(this,true,0);
  AddFunctionToLibraryObject
            (this,object,0xf3,(FunctionInfo *)WabtInterface::EntryInfo::ConvertWast2Wasm,1,'\x06');
  uVar3 = (ulong)uVar4 << 0x20;
  (*(webAssemblyObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(webAssemblyObject,0xf2,object,0,0,0,uVar3);
  ptr = AddFunctionToLibraryObject
                  (this,webAssemblyObject,0x19f,(FunctionInfo *)WebAssembly::EntryInfo::Compile,1,
                   '\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
            (&this->webAssemblyCompileFunction,ptr);
  AddFunctionToLibraryObject
            (this,webAssemblyObject,0xe1,(FunctionInfo *)WebAssembly::EntryInfo::CompileStreaming,1,
             '\x06');
  AddFunctionToLibraryObject
            (this,webAssemblyObject,0xe0,(FunctionInfo *)WebAssembly::EntryInfo::Validate,1,'\x06');
  AddFunctionToLibraryObject
            (this,webAssemblyObject,0xe2,(FunctionInfo *)WebAssembly::EntryInfo::Instantiate,1,
             '\x06');
  AddFunctionToLibraryObject
            (this,webAssemblyObject,0xe3,
             (FunctionInfo *)WebAssembly::EntryInfo::InstantiateStreaming,1,'\x06');
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)WebAssembly::EntryInfo::QueryResponse,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x186);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
            (&this->webAssemblyQueryResponseFunction,&pRVar1->super_JavascriptFunction);
  pRVar1 = DefaultCreateFunction
                     (this,(FunctionInfo *)WebAssembly::EntryInfo::InstantiateBound,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x186);
  this_00 = (JavascriptLibrary *)&this->webAssemblyInstantiateBoundFunction;
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
            ((WriteBarrierPtr<Js::JavascriptFunction> *)this_00,&pRVar1->super_JavascriptFunction);
  AddFunction(this_00,webAssemblyObject,0xd9,(this->webAssemblyModuleConstructor).ptr);
  AddFunction(this_00,webAssemblyObject,0xda,(this->webAssemblyInstanceConstructor).ptr);
  AddFunction(this_00,webAssemblyObject,0xdd,(this->webAssemblyCompileErrorConstructor).ptr);
  AddFunction(this_00,webAssemblyObject,0xde,(this->webAssemblyRuntimeErrorConstructor).ptr);
  AddFunction(this_00,webAssemblyObject,0xdf,(this->webAssemblyLinkErrorConstructor).ptr);
  AddFunction(this_00,webAssemblyObject,0xdb,(this->webAssemblyMemoryConstructor).ptr);
  AddFunction(this_00,webAssemblyObject,0xdc,(this->webAssemblyTableConstructor).ptr);
  pJVar2 = CreateStringFromCppLiteral<12ul>(this,(char16 (*) [12])0xdfe6b0);
  (*(webAssemblyObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])
            (webAssemblyObject,0x1b,pJVar2,2,0,0,uVar3 & 0xffffffff00000000);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWebAssemblyObject(DynamicObject* webAssemblyObject, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        JavascriptLibrary* library = webAssemblyObject->GetLibrary();
        int slots = 9;
#ifdef ENABLE_WABT
        // Attaching wabt for testing
        ++slots;
#endif
        typeHandler->Convert(webAssemblyObject, mode, slots);

#ifdef ENABLE_WABT
        // Build wabt object
        Js::DynamicObject* wabtObject = library->CreateObject(true);
        library->AddFunctionToLibraryObject(wabtObject, PropertyIds::convertWast2Wasm, &WabtInterface::EntryInfo::ConvertWast2Wasm, 1);
        library->AddMember(webAssemblyObject, PropertyIds::wabt, wabtObject, PropertyNone);
#endif
        library->webAssemblyCompileFunction =
            library->AddFunctionToLibraryObject(webAssemblyObject, PropertyIds::compile, &WebAssembly::EntryInfo::Compile, 1);
        library->AddFunctionToLibraryObject(webAssemblyObject, PropertyIds::compileStreaming, &WebAssembly::EntryInfo::CompileStreaming, 1);
        library->AddFunctionToLibraryObject(webAssemblyObject, PropertyIds::validate, &WebAssembly::EntryInfo::Validate, 1);
        library->AddFunctionToLibraryObject(webAssemblyObject, PropertyIds::instantiate, &WebAssembly::EntryInfo::Instantiate, 1);
        library->AddFunctionToLibraryObject(webAssemblyObject, PropertyIds::instantiateStreaming, &WebAssembly::EntryInfo::InstantiateStreaming, 1);
        library->webAssemblyQueryResponseFunction = library->DefaultCreateFunction(&WebAssembly::EntryInfo::QueryResponse, 1, nullptr, nullptr, PropertyIds::undefined);
        library->webAssemblyInstantiateBoundFunction = library->DefaultCreateFunction(&WebAssembly::EntryInfo::InstantiateBound, 1, nullptr, nullptr, PropertyIds::undefined);

        library->AddFunction(webAssemblyObject, PropertyIds::Module, library->webAssemblyModuleConstructor);

        library->AddFunction(webAssemblyObject, PropertyIds::Instance, library->webAssemblyInstanceConstructor);

        library->AddFunction(webAssemblyObject, PropertyIds::CompileError, library->webAssemblyCompileErrorConstructor);
        library->AddFunction(webAssemblyObject, PropertyIds::RuntimeError, library->webAssemblyRuntimeErrorConstructor);
        library->AddFunction(webAssemblyObject, PropertyIds::LinkError, library->webAssemblyLinkErrorConstructor);
        library->AddFunction(webAssemblyObject, PropertyIds::Memory, library->webAssemblyMemoryConstructor);
        library->AddFunction(webAssemblyObject, PropertyIds::Table, library->webAssemblyTableConstructor);

        library->AddMember(webAssemblyObject, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("WebAssembly")), PropertyConfigurable);

        return true;
    }